

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidget *widget,IteratorFlags flags)

{
  long lVar1;
  bool bVar2;
  QTreeWidgetItem *pQVar3;
  parameter_type t;
  undefined4 in_EDX;
  QTreeWidgetItemIteratorPrivate *in_RSI;
  QTreeModel *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *unaff_retaddr;
  QTreeWidgetItemIterator *in_stack_00000008;
  QTreeModel *model;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
  ::QScopedPointer((QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
                    *)in_RDI,(QTreeWidgetItemIteratorPrivate *)0x0);
  *(undefined8 *)&in_RDI->field_0x8 = 0;
  *(undefined4 *)&in_RDI->rootItem = in_EDX;
  QAbstractItemView::model((QAbstractItemView *)in_RSI);
  pQVar3 = (QTreeWidgetItem *)qobject_cast<QTreeModel*>((QObject *)0x931e3d);
  t = (parameter_type)operator_new(0x30);
  QTreeWidgetItemIteratorPrivate::QTreeWidgetItemIteratorPrivate
            (in_RSI,(QTreeWidgetItemIterator *)pQVar3,in_RDI);
  QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
  ::reset((QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
           *)in_RDI,(QTreeWidgetItemIteratorPrivate *)pQVar3);
  QList<QTreeWidgetItemIterator_*>::append((QList<QTreeWidgetItemIterator_*> *)0x931e83,t);
  bVar2 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x931e95);
  if (!bVar2) {
    pQVar3 = QTreeWidgetItem::child(pQVar3,(int)((ulong)in_RDI >> 0x20));
    *(QTreeWidgetItem **)&in_RDI->field_0x8 = pQVar3;
  }
  if (*(long *)&in_RDI->field_0x8 != 0) {
    bVar2 = matchesFlags(in_stack_00000008,unaff_retaddr);
    if (!bVar2) {
      operator++((QTreeWidgetItemIterator *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidget *widget, IteratorFlags flags)
: current(nullptr), flags(flags)
{
    Q_ASSERT(widget);
    QTreeModel *model = qobject_cast<QTreeModel*>(widget->model());
    Q_ASSERT(model);
    d_ptr.reset(new QTreeWidgetItemIteratorPrivate(this, model));
    model->iterators.append(this);
    if (!model->rootItem->children.isEmpty()) current = model->rootItem->child(0);
    if (current && !matchesFlags(current))
        ++(*this);
}